

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

Abc_Obj_t * Abc_NtkAreaOptOne(Sfm_Dec_t *p,int i)

{
  Abc_Ntk_t *pNtk;
  Sfm_Par_t *pPars;
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  timespec ts;
  
  if (-1 < i) {
    pNtk = p->pNtk;
    if (i < pNtk->vObjs->nSize) {
      pPars = p->pPars;
      pAVar4 = (Abc_Obj_t *)pNtk->vObjs->pArray[(uint)i];
      if ((1 < pPars->nMffcMin) &&
         (iVar1 = Abc_NodeMffcLabel(pAVar4,(Vec_Ptr_t *)0x0), iVar1 < pPars->nMffcMin)) {
        return (Abc_Obj_t *)0x0;
      }
      iVar1 = pPars->iNodeOne;
      if (iVar1 == 0 || iVar1 == i) {
        if (iVar1 != 0) {
          pPars->fVeryVerbose = (uint)(iVar1 == i);
        }
        p->nNodesTried = p->nNodesTried + 1;
        iVar1 = clock_gettime(3,(timespec *)&ts);
        if (iVar1 < 0) {
          lVar5 = 1;
        }
        else {
          lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        iVar1 = Sfm_DecExtract(pNtk,pPars,pAVar4,&p->vObjRoots,&p->vObjGates,&p->vObjFanins,
                               &p->vObjMap,&p->vGateTfi,&p->vGateTfo,&p->vObjMffc,&p->vObjInMffc,
                               (Sfm_Tim_t *)0x0,(Sfm_Mit_t *)0x0);
        p->nDivs = iVar1;
        iVar1 = clock_gettime(3,(timespec *)&ts);
        if (iVar1 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        p->timeWin = p->timeWin + lVar6 + lVar5;
        if ((pPars->nWinSizeMax == 0) || ((p->vObjGates).nSize <= pPars->nWinSizeMax)) {
          p->nMffc = (p->vObjMffc).nSize;
          iVar1 = Sfm_DecMffcArea(pNtk,&p->vObjMffc);
          p->AreaMffc = iVar1;
          iVar1 = p->nDivs;
          iVar2 = p->nMaxDivs;
          if (p->nMaxDivs <= iVar1) {
            iVar2 = iVar1;
          }
          p->nMaxDivs = iVar2;
          p->nAllDivs = p->nAllDivs + (long)iVar1;
          p->iTarget = (pAVar4->field_6).iTemp;
          iVar1 = (p->vObjGates).nSize;
          iVar2 = p->nMaxWin;
          if (p->nMaxWin <= iVar1) {
            iVar2 = iVar1;
          }
          p->nMaxWin = iVar2;
          p->nAllWin = p->nAllWin + (long)iVar1;
          iVar2 = clock_gettime(3,(timespec *)&ts);
          if (iVar2 < 0) {
            lVar5 = 1;
          }
          else {
            lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          iVar2 = Sfm_DecPrepareSolver(p);
          iVar3 = clock_gettime(3,(timespec *)&ts);
          if (iVar3 < 0) {
            lVar6 = -1;
          }
          else {
            lVar6 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeCnf = p->timeCnf + lVar6 + lVar5;
          if (iVar2 != 0) {
            iVar2 = clock_gettime(3,(timespec *)&ts);
            if (iVar2 < 0) {
              lVar5 = 1;
            }
            else {
              lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
              lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + ts.tv_sec * -1000000;
            }
            iVar2 = Sfm_DecPeformDec2(p,pAVar4);
            if (((pPars->fMoreEffort != 0) && (iVar2 < 0)) &&
               (uVar7 = (ulong)(p->vObjInMffc).nSize, 0 < (long)uVar7)) {
              do {
                if ((long)(p->vObjInMffc).nSize < (long)uVar7) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                p->iUseThis = (p->vObjInMffc).pArray[uVar7 - 1];
                iVar2 = Sfm_DecPeformDec2(p,pAVar4);
                p->iUseThis = -1;
                if (-1 < iVar2) {
                  p->nEfforts = p->nEfforts + 1;
                  break;
                }
                bVar8 = 1 < uVar7;
                uVar7 = uVar7 - 1;
              } while (bVar8);
            }
            if (p->pPars->fVeryVerbose != 0) {
              puts("\n");
            }
            iVar3 = clock_gettime(3,(timespec *)&ts);
            if (iVar3 < 0) {
              lVar6 = -1;
            }
            else {
              lVar6 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            p->timeSat = p->timeSat + lVar6 + lVar5;
            if (-1 < iVar2) {
              p->nNodesChanged = p->nNodesChanged + 1;
              Abc_NtkCountStats(p,iVar1);
              pAVar4 = Sfm_DecInsert(pNtk,pAVar4,iVar1,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                                     &p->vGateHands,p->GateBuffer,p->GateInvert,&p->vGateFuncs,
                                     (Vec_Int_t *)0x0,p->pMit);
              return pAVar4;
            }
          }
        }
      }
      return (Abc_Obj_t *)0x0;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NtkAreaOptOne( Sfm_Dec_t * p, int i )
{
    abctime clk;
    Abc_Ntk_t * pNtk = p->pNtk;
    Sfm_Par_t * pPars = p->pPars;
    Abc_Obj_t * pObj = Abc_NtkObj( p->pNtk, i ); 
    int Limit, RetValue;
    if ( pPars->nMffcMin > 1 && Abc_NodeMffcLabel(pObj, NULL) < pPars->nMffcMin )
        return NULL;
    if ( pPars->iNodeOne && i != pPars->iNodeOne )
        return NULL;
    if ( pPars->iNodeOne )
        pPars->fVeryVerbose = (int)(i == pPars->iNodeOne);
    p->nNodesTried++;
clk = Abc_Clock();
    p->nDivs = Sfm_DecExtract( pNtk, pPars, pObj, &p->vObjRoots, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateTfi, &p->vGateTfo, &p->vObjMffc, &p->vObjInMffc, NULL, NULL );
p->timeWin += Abc_Clock() - clk;
    if ( pPars->nWinSizeMax && pPars->nWinSizeMax < Vec_IntSize(&p->vObjGates) )
        return NULL;
    p->nMffc = Vec_IntSize(&p->vObjMffc);
    p->AreaMffc = Sfm_DecMffcArea(pNtk, &p->vObjMffc);
    p->nMaxDivs = Abc_MaxInt( p->nMaxDivs, p->nDivs );
    p->nAllDivs += p->nDivs;
    p->iTarget = pObj->iTemp;
    Limit = Vec_IntSize( &p->vObjGates );
    p->nMaxWin = Abc_MaxInt( p->nMaxWin, Limit );
    p->nAllWin += Limit;
clk = Abc_Clock();
    RetValue = Sfm_DecPrepareSolver( p );
p->timeCnf += Abc_Clock() - clk;
    if ( !RetValue )
        return NULL;
clk = Abc_Clock();
    RetValue = Sfm_DecPeformDec2( p, pObj );
    if ( pPars->fMoreEffort && RetValue < 0 )
    {
        int Var, i;
        Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
        {
            p->iUseThis = Var; 
            RetValue = Sfm_DecPeformDec2( p, pObj );
            p->iUseThis = -1;
            if ( RetValue < 0 )
            {
                //printf( "Node %d: Not found among %d.\n", Abc_ObjId(pObj), Vec_IntSize(&p->vObjInMffc) );
            }
            else
            {
                p->nEfforts++;
                if ( p->pPars->fVerbose )
                {
                    //printf( "Node %5d: (%2d out of %2d)  Gate=%s ", Abc_ObjId(pObj), i, Vec_IntSize(&p->vObjInMffc), Mio_GateReadName((Mio_Gate_t*)pObj->pData) );
                    //Dau_DsdPrintFromTruth( p->Copy, p->nSuppVars );
                }
                break;
            }
        }
    }
    if ( p->pPars->fVeryVerbose )
        printf( "\n\n" );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue < 0 )
        return NULL;
    p->nNodesChanged++;
    Abc_NtkCountStats( p, Limit );
    return Sfm_DecInsert( pNtk, pObj, Limit, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateHands, p->GateBuffer, p->GateInvert, &p->vGateFuncs, NULL, p->pMit );
}